

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

void display(GLFWwindow *window)

{
  float fVar1;
  float fVar2;
  int *piVar3;
  GLFWwindow *window_local;
  
  if ((using_toon) || (using_sketch)) {
    glClearColor(0x3f800000,0x3f800000,0x3f800000,0);
  }
  else {
    glClearColor(0,0,0);
  }
  glClear(0x4000);
  glMatrixMode(0x1700);
  glLoadIdentity();
  glPushMatrix();
  glTranslatef(Translation[0],Translation[1],Translation[2]);
  fVar1 = (float)Width_global;
  fVar2 = (float)Height_global;
  piVar3 = std::min<int>(&Width_global,&Height_global);
  drawCircle(fVar1 / 2.0,fVar2 / 2.0,((float)*piVar3 * 0.8) / 2.0);
  glPopMatrix();
  glfwSwapBuffers(window);
  return;
}

Assistant:

void display( GLFWwindow* window )
{
    if(!using_toon && !using_sketch) glClearColor( 0.0f, 0.0f, 0.0f, 0.0f );      //clear background screen to black if not using toon/sketch shade
    else glClearColor(1.0f, 1.0f, 1.0f, 0.0f); //clear background to white to see silhouttes of toon shade
    
    glClear(GL_COLOR_BUFFER_BIT);                // clear the color buffer (sets everything to black)
    
    glMatrixMode(GL_MODELVIEW);                  // indicate we are specifying camera transformations
    glLoadIdentity();                            // make sure transformation is "zero'd"
    
    //----------------------- code to draw objects --------------------------
    glPushMatrix();
    glTranslatef (Translation[0], Translation[1], Translation[2]);
    drawCircle(
        Width_global / 2.0 , 
        Height_global / 2.0 , 
        min(Width_global, Height_global) * 0.8 / 2.0);  // present a sphere with max radius possible on screen
    glPopMatrix();
    
    glfwSwapBuffers(window);
    
}